

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlParseElementStart(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlParserInputPtr pxVar2;
  _xmlNode *p_Var3;
  xmlDocPtr doc;
  byte *pbVar4;
  _xmlSAXHandler *p_Var5;
  int *piVar6;
  uint uVar7;
  xmlChar *pxVar8;
  int *piVar9;
  xmlNodePtr pxVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  xmlChar *URI;
  xmlChar *prefix;
  int tlen;
  xmlParserNodeInfo node_info;
  xmlChar *local_70;
  xmlChar *local_68;
  int local_5c;
  xmlParserNodeInfo local_58;
  
  local_68 = (xmlChar *)0x0;
  local_70 = (xmlChar *)0x0;
  local_5c = 0;
  iVar13 = ctxt->nsNr;
  if ((xmlParserMaxDepth < (uint)ctxt->nameNr) && ((ctxt->options & 0x80000) == 0)) {
    xmlFatalErrMsgInt(ctxt,XML_ERR_INTERNAL_ERROR,
                      "Excessive depth in document: %d use XML_PARSE_HUGE option\n",
                      xmlParserMaxDepth);
    xmlHaltParser(ctxt);
    return -1;
  }
  if (ctxt->record_info != 0) {
    pxVar2 = ctxt->input;
    local_58.begin_pos = (unsigned_long)(pxVar2->cur + (pxVar2->consumed - (long)pxVar2->base));
    local_58.begin_line = (unsigned_long)pxVar2->line;
  }
  if (ctxt->spaceNr == 0) {
    iVar12 = -1;
  }
  else {
    iVar12 = -1;
    if (*ctxt->space != -2) {
      iVar12 = *ctxt->space;
    }
  }
  spacePush(ctxt,iVar12);
  iVar12 = ctxt->input->line;
  if (ctxt->sax2 == 0) {
    pxVar8 = xmlParseStartTag(ctxt);
  }
  else {
    pxVar8 = xmlParseStartTag2(ctxt,&local_68,&local_70,&local_5c);
  }
  iVar11 = -1;
  if (ctxt->instate == XML_PARSER_EOF) {
    return -1;
  }
  if (pxVar8 == (xmlChar *)0x0) {
    iVar13 = ctxt->spaceNr;
    if ((long)iVar13 < 1) {
      return -1;
    }
    ctxt->spaceNr = iVar13 - 1U;
    piVar6 = ctxt->spaceTab;
    piVar9 = piVar6 + (long)iVar13 + -2;
    if (iVar13 == 1) {
      piVar9 = piVar6;
    }
    ctxt->space = piVar9;
    piVar6[iVar13 - 1U] = -1;
    return -1;
  }
  if (ctxt->sax2 == 0) {
    namePush(ctxt,pxVar8);
  }
  else {
    nameNsPush(ctxt,pxVar8,local_68,local_70,ctxt->nsNr - iVar13);
  }
  p_Var3 = ctxt->node;
  if ((((ctxt->validate != 0) && (ctxt->wellFormed != 0)) &&
      (doc = ctxt->myDoc, p_Var3 != (_xmlNode *)0x0 && doc != (xmlDocPtr)0x0)) &&
     (p_Var3 == doc->children)) {
    uVar7 = xmlValidateRoot(&ctxt->vctxt,doc);
    ctxt->valid = ctxt->valid & uVar7;
  }
  pxVar2 = ctxt->input;
  pbVar4 = pxVar2->cur;
  bVar1 = *pbVar4;
  if (ctxt->mlType == XML_TYPE_SML) {
    if (bVar1 < 0x7b) {
      if (bVar1 != 10) {
        if (bVar1 != 0x3b) {
LAB_0016665c:
          ctxt->curly = 0;
          return 0;
        }
        pxVar2->cur = pbVar4 + 1;
        pxVar2->col = pxVar2->col + 1;
        bVar1 = pbVar4[1];
joined_r0x00166649:
        if (bVar1 == 0) {
          xmlParserInputGrow(pxVar2,0xfa);
        }
      }
    }
    else {
      if (bVar1 == 0x7b) goto LAB_001666c5;
      if (bVar1 != 0x7d) goto LAB_0016665c;
    }
    p_Var5 = ctxt->sax;
    if (ctxt->sax2 == 0) {
      if (((p_Var5 != (_xmlSAXHandler *)0x0) && (p_Var5->endElement != (endElementSAXFunc)0x0)) &&
         (ctxt->disableSAX == 0)) {
        (*p_Var5->endElement)(ctxt->userData,pxVar8);
      }
    }
    else if (((p_Var5 != (_xmlSAXHandler *)0x0) &&
             (p_Var5->endElementNs != (endElementNsSAX2Func)0x0)) && (ctxt->disableSAX == 0)) {
      (*p_Var5->endElementNs)(ctxt->userData,pxVar8,local_68,local_70);
    }
    iVar12 = ctxt->nameNr;
    if (0 < (long)iVar12) {
      ctxt->nameNr = iVar12 - 1U;
      if (iVar12 == 1) {
        pxVar8 = (xmlChar *)0x0;
      }
      else {
        pxVar8 = ctxt->nameTab[(long)iVar12 + -2];
      }
      ctxt->name = pxVar8;
      ctxt->nameTab[iVar12 - 1U] = (xmlChar *)0x0;
    }
    iVar12 = ctxt->spaceNr;
    if (0 < (long)iVar12) {
      ctxt->spaceNr = iVar12 - 1U;
      piVar6 = ctxt->spaceTab;
      piVar9 = piVar6 + (long)iVar12 + -2;
      if (iVar12 == 1) {
        piVar9 = piVar6;
      }
      ctxt->space = piVar9;
      piVar6[iVar12 - 1U] = -1;
    }
    iVar13 = ctxt->nsNr - iVar13;
    if (iVar13 != 0) {
      nsPop(ctxt,iVar13);
    }
    iVar11 = 1;
LAB_0016687e:
    if ((p_Var3 != (_xmlNode *)0x0) && (ctxt->record_info != 0)) {
      pxVar2 = ctxt->input;
      local_58.end_pos = (unsigned_long)(pxVar2->cur + (pxVar2->consumed - (long)pxVar2->base));
      local_58.end_line = (unsigned_long)pxVar2->line;
      local_58.node = p_Var3;
      xmlParserAddNodeInfo(ctxt,&local_58);
    }
  }
  else {
    if (ctxt->mlType == XML_TYPE_XML) {
      if (bVar1 != 0x3e) {
        if ((bVar1 == 0x2f) && (pbVar4[1] == 0x3e)) {
          pxVar2->cur = pbVar4 + 2;
          pxVar2->col = pxVar2->col + 2;
          bVar1 = pbVar4[2];
          goto joined_r0x00166649;
        }
        xmlFatalErrMsgStrIntStr
                  (ctxt,XML_ERR_GT_REQUIRED,"Couldn\'t find end of Start Tag %s line %d\n",pxVar8,
                   iVar12,(xmlChar *)0x0);
        iVar12 = ctxt->nodeNr;
        if (0 < (long)iVar12) {
          ctxt->nodeNr = iVar12 - 1U;
          if (iVar12 == 1) {
            pxVar10 = (xmlNodePtr)0x0;
          }
          else {
            pxVar10 = ctxt->nodeTab[(long)iVar12 + -2];
          }
          ctxt->node = pxVar10;
          ctxt->nodeTab[iVar12 - 1U] = (xmlNodePtr)0x0;
        }
        iVar12 = ctxt->nameNr;
        if (0 < (long)iVar12) {
          ctxt->nameNr = iVar12 - 1U;
          if (iVar12 == 1) {
            pxVar8 = (xmlChar *)0x0;
          }
          else {
            pxVar8 = ctxt->nameTab[(long)iVar12 + -2];
          }
          ctxt->name = pxVar8;
          ctxt->nameTab[iVar12 - 1U] = (xmlChar *)0x0;
        }
        iVar12 = ctxt->spaceNr;
        if (0 < (long)iVar12) {
          ctxt->spaceNr = iVar12 - 1U;
          piVar6 = ctxt->spaceTab;
          piVar9 = piVar6 + (long)iVar12 + -2;
          if (iVar12 == 1) {
            piVar9 = piVar6;
          }
          ctxt->space = piVar9;
          piVar6[iVar12 - 1U] = -1;
        }
        iVar13 = ctxt->nsNr - iVar13;
        if (iVar13 != 0) {
          nsPop(ctxt,iVar13);
        }
        goto LAB_0016687e;
      }
    }
    else {
      if (bVar1 != 0x7b) goto LAB_0016665c;
LAB_001666c5:
      ctxt->curly = 1;
    }
    pxVar2->col = pxVar2->col + 1;
    pxVar2->cur = pbVar4 + 1;
    iVar11 = 0;
    if (pbVar4[1] == 0) {
      xmlParserInputGrow(pxVar2,0xfa);
      iVar11 = 0;
    }
  }
  return iVar11;
}

Assistant:

static int
xmlParseElementStart(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    const xmlChar *prefix = NULL;
    const xmlChar *URI = NULL;
    xmlParserNodeInfo node_info;
    int line, tlen = 0;
    xmlNodePtr ret;
    int nsNr = ctxt->nsNr;

    DEBUG_ENTER(("xmlParseElementStart(%s);\n", dbgCtxt(ctxt)));

    if (((unsigned int) ctxt->nameNr > xmlParserMaxDepth) &&
        ((ctxt->options & XML_PARSE_HUGE) == 0)) {
	xmlFatalErrMsgInt(ctxt, XML_ERR_INTERNAL_ERROR,
		 "Excessive depth in document: %d use XML_PARSE_HUGE option\n",
			  xmlParserMaxDepth);
	xmlHaltParser(ctxt);
	RETURN_INT(-1);
    }

    /* Capture start position */
    if (ctxt->record_info) {
        node_info.begin_pos = ctxt->input->consumed +
                          (CUR_PTR - ctxt->input->base);
	node_info.begin_line = ctxt->input->line;
    }

    /* TODO FOR SML: Move ctxt->curly to one of these spaces, to avoid having to save it manually? */
    if (ctxt->spaceNr == 0)
	spacePush(ctxt, -1);
    else if (*ctxt->space == -2)
	spacePush(ctxt, -1);
    else
	spacePush(ctxt, *ctxt->space);

    line = ctxt->input->line;
#ifdef LIBXML_SAX1_ENABLED
    if (ctxt->sax2)
#endif /* LIBXML_SAX1_ENABLED */
        name = xmlParseStartTag2(ctxt, &prefix, &URI, &tlen);
#ifdef LIBXML_SAX1_ENABLED
    else
	name = xmlParseStartTag(ctxt);
#endif /* LIBXML_SAX1_ENABLED */
    if (ctxt->instate == XML_PARSER_EOF)
	RETURN_INT(-1);
    if (name == NULL) {
	spacePop(ctxt);
        RETURN_INT(-1);
    }
    if (ctxt->sax2)
        nameNsPush(ctxt, name, prefix, URI, ctxt->nsNr - nsNr);
#ifdef LIBXML_SAX1_ENABLED
    else
        namePush(ctxt, name);
#endif /* LIBXML_SAX1_ENABLED */
    ret = ctxt->node;

#ifdef LIBXML_VALID_ENABLED
    /*
     * [ VC: Root Element Type ]
     * The Name in the document type declaration must match the element
     * type of the root element.
     */
    if (ctxt->validate && ctxt->wellFormed && ctxt->myDoc &&
        ctxt->node && (ctxt->node == ctxt->myDoc->children))
        ctxt->valid &= xmlValidateRoot(&ctxt->vctxt, ctxt->myDoc);
#endif /* LIBXML_VALID_ENABLED */

    /*
     * Check for an Empty Element.
     */
    if (   (ISXML && (RAW == '/') && (NXT(1) == '>'))
    	|| (ISSML && ((RAW == '\n') || (RAW == ';') || (RAW == '}')))) {
        if (ISXML) {						/* XML */
            SKIP(2);
        } else {						/* SML */
            if (RAW == ';') { /* But do not skip '}', which can't belong to an empty element */
		SKIP(1);
            }
        }
	if (ctxt->sax2) {
	    if ((ctxt->sax != NULL) && (ctxt->sax->endElementNs != NULL) &&
		(!ctxt->disableSAX))
		ctxt->sax->endElementNs(ctxt->userData, name, prefix, URI);
#ifdef LIBXML_SAX1_ENABLED
	} else {
	    if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL) &&
		(!ctxt->disableSAX))
		ctxt->sax->endElement(ctxt->userData, name);
#endif /* LIBXML_SAX1_ENABLED */
	}
	namePop(ctxt);
	spacePop(ctxt);
	if (nsNr != ctxt->nsNr)
	    nsPop(ctxt, ctxt->nsNr - nsNr);
	if ( ret != NULL && ctxt->record_info ) {
	   node_info.end_pos = ctxt->input->consumed +
			      (CUR_PTR - ctxt->input->base);
	   node_info.end_line = ctxt->input->line;
	   node_info.node = ret;
	   xmlParserAddNodeInfo(ctxt, &node_info);
	}
	RETURN_INT_COMMENT(1, ("xmlParseElement. ctxt = %s;\n", dbgCtxt(ctxt)));
    }
    if (ISXML) {						/* XML */
	if (RAW == '>') {
	    NEXT1;
	} else {
	    xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_GT_REQUIRED,
			 "Couldn't find end of Start Tag %s line %d\n",
				    name, line, NULL);

	    /*
	     * end of parsing of this node.
	     */
	    nodePop(ctxt);
	    namePop(ctxt);
	    spacePop(ctxt);
	    if (nsNr != ctxt->nsNr)
		nsPop(ctxt, ctxt->nsNr - nsNr);

	    /*
	     * Capture end position and add node
	     */
	    if ( ret != NULL && ctxt->record_info ) {
	       node_info.end_pos = ctxt->input->consumed +
				  (CUR_PTR - ctxt->input->base);
	       node_info.end_line = ctxt->input->line;
	       node_info.node = ret;
	       xmlParserAddNodeInfo(ctxt, &node_info);
	    }
	RETURN_INT_COMMENT(-1, ("xmlParseElement. ctxt = %s;\n", dbgCtxt(ctxt)));
	}
    } else {							/* SML */
	if (RAW == '{') {
	    ctxt->curly = 1;
	    NEXT1;
	} else {
	    ctxt->curly = 0;
	}
	DEBUG_PRINTF(("curly = %d;\n", ctxt->curly));
    	/* TODO FOR SML: Is there any test to do here to detect and report invalid tag definitions? */
    }

    RETURN_INT(0);
}